

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_Test::testBody
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_Test *this)

{
  bool bVar1;
  void *mem;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char *memory;
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_Test *this_local;
  
  MemoryLeakWarningPlugin::setGlobalDetector
            (&((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
              dummyDetector)->super_MemoryLeakDetector,
             (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyReporter
            );
  MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
  crash_on_allocation_number(1);
  mem = operator_new__(100,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                       ,0x116);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = cpputestHasCrashed;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(bVar1 & 1),"CHECK","cpputestHasCrashed",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x117,pTVar3);
  if (mem != (void *)0x0) {
    operator_delete__(mem);
  }
  MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorNew)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = new char[100];
    CHECK(cpputestHasCrashed);
    delete [] memory;
    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}